

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,_Bool *done)

{
  ulong uVar1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  SessionHandle *data;
  _func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var5;
  void *pvVar6;
  curl_off_t *pcVar7;
  curl_off_t cVar8;
  _Bool _Var9;
  uint uVar10;
  CURLcode CVar11;
  CHUNKcode code;
  CURLcode extraout_EAX;
  int iVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  char *pcVar16;
  char cVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong uVar21;
  uint uVar22;
  curl_socket_t readfd0;
  ulong unaff_R12;
  uint uVar23;
  long lVar24;
  bool bVar25;
  timeval tVar26;
  _Bool readmore;
  CURLcode local_54;
  ssize_t bytes_written;
  uint local_48;
  _Bool local_41;
  _Bool *local_40;
  long local_38;
  
  data = conn->data;
  uVar10 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar23 = (data->req).keepon;
  uVar20 = 0xffffffff;
  readfd0 = -1;
  if ((uVar23 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar23 & 0x2a) == 2) {
    uVar20 = (ulong)(uint)conn->writesockfd;
  }
  if (uVar10 == 0) {
    uVar10 = Curl_socket_check(readfd0,-1,(curl_socket_t)uVar20,0);
    uVar20 = extraout_RDX;
  }
  if (uVar10 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  uVar23 = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar10 & 1) != 0 || ((conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    uVar23 = 0;
    local_38 = 0;
    unaff_R12 = 0;
    local_40 = done;
    do {
      sVar18 = (data->set).buffer_size;
      if (sVar18 == 0) {
        sVar18 = 0x4000;
      }
      lVar13 = (data->req).size;
      if (((lVar13 != -1) && ((data->req).header == false)) &&
         (sVar14 = lVar13 - (data->req).bytecount, (long)sVar14 < (long)sVar18)) {
        sVar18 = sVar14;
      }
      if (sVar18 == 0) {
        bytes_written = 0;
LAB_004861c1:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), uVar20 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          tVar26 = curlx_tvnow();
          uVar20 = tVar26.tv_usec;
          (data->req).start100 = tVar26;
        }
        if (bytes_written == 0) {
          uVar20 = CONCAT71((int7)(uVar20 >> 8),(data->req).bodywrites == 0);
        }
        else {
          uVar20 = 0;
        }
        if (bytes_written < 1 && (uVar20 & 1) == 0) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          iVar12 = 2;
          uVar23 = 1;
        }
        else {
          (data->req).buf[bytes_written] = '\0';
          (data->req).str = (data->req).buf;
          p_Var5 = conn->handler->readwrite;
          local_48 = (uint)uVar20;
          if (p_Var5 != (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                        0x0) {
            CVar11 = (*p_Var5)(data,conn,&bytes_written,&readmore);
            uVar23 = 1;
            uVar20 = extraout_RDX_02;
            if (CVar11 == CURLE_OK) {
              unaff_R12 = 0;
              iVar12 = 2;
              uVar20 = (ulong)local_48;
              if (readmore != false) goto LAB_00486290;
              goto LAB_004862c3;
            }
LAB_0048626d:
            uVar23 = 1;
            unaff_R12 = (ulong)CVar11;
            goto LAB_00486270;
          }
LAB_004862c3:
          if ((data->req).header == true) {
            local_41 = false;
            CVar11 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_41);
            uVar23 = 1;
            if (CVar11 == CURLE_OK) {
              p_Var5 = conn->handler->readwrite;
              uVar20 = (ulong)local_48;
              if (((p_Var5 == (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr
                               *)0x0) || (0 < (data->req).maxdownload)) || (bytes_written < 1)) {
LAB_00486407:
                if (local_41 == true) {
                  iVar12 = 2;
                  if (0 < bytes_written) {
                    _Var9 = Curl_multi_pipeline_enabled(conn->data->multi);
                    if (_Var9) {
                      Curl_infof(data,
                                 "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                                 bytes_written);
                      conn->read_pos = conn->read_pos - bytes_written;
                      (conn->bits).stream_was_rewound = true;
                    }
                    else {
                      Curl_infof(data,
                                 "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                                 ,bytes_written);
                    }
                    unaff_R12 = 0;
                    goto LAB_00486303;
                  }
                  bVar25 = false;
                }
                else {
                  iVar12 = 0;
                  bVar25 = true;
                }
                unaff_R12 = 0;
              }
              else {
                CVar11 = (*p_Var5)(data,conn,&bytes_written,&readmore);
                unaff_R12 = 0;
                if (CVar11 != CURLE_OK) goto LAB_004862ff;
                uVar20 = (ulong)local_48;
                if (readmore == false) goto LAB_00486407;
                iVar12 = 2;
                bVar25 = false;
              }
            }
            else {
LAB_004862ff:
              unaff_R12 = (ulong)CVar11;
              iVar12 = 1;
              local_54 = CVar11;
LAB_00486303:
              bVar25 = false;
              uVar20 = (ulong)local_48;
            }
            if (!bVar25) goto LAB_00486290;
          }
          if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
             (0 < bytes_written || (uVar20 & 1) != 0)) {
            if (((data->req).bodywrites == 0 && (uVar20 & 1) == 0) &&
               ((conn->handler->protocol & 0x40003) != 0)) {
              if ((data->req).newurl == (char *)0x0) {
LAB_004864a2:
                if ((((data->state).resume_from == 0) || ((data->req).content_range != false)) ||
                   (((data->set).httpreq != HTTPREQ_GET || ((data->req).ignorebody != false)))) {
                  if ((((data->set).timecondition == CURL_TIMECOND_NONE) ||
                      ((data->state).range != (char *)0x0)) ||
                     (_Var9 = Curl_meets_timecondition(data,(data->req).timeofdoc), _Var9))
                  goto LAB_004864f5;
                  *local_40 = true;
                  (data->info).httpcode = 0x130;
                  local_54 = CURLE_OK;
                  Curl_infof(data,"Simulate a HTTP 304 response!\n");
                  (conn->bits).close = true;
                  uVar20 = extraout_RDX_09;
                }
                else {
                  Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume."
                            );
                  local_54 = CURLE_RANGE_ERROR;
                  uVar20 = extraout_RDX_10;
                }
              }
              else {
                if ((conn->bits).close != true) {
                  (data->req).ignorebody = true;
                  Curl_infof(data,"Ignoring the response-body\n");
                  goto LAB_004864a2;
                }
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                *local_40 = true;
                local_54 = CURLE_OK;
              }
LAB_00486630:
              uVar23 = 1;
              iVar12 = 1;
              goto LAB_00486290;
            }
LAB_004864f5:
            plVar3 = &(data->req).bodywrites;
            *plVar3 = *plVar3 + 1;
            if (((data->set).verbose == true) &&
               (((data->req).badheader == HEADER_NORMAL ||
                (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen,conn)
                , (data->req).badheader == HEADER_PARTHEADER)))) {
              Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
            }
            if ((data->req).chunk == true) {
              code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
              if (code < CHUNKE_TOO_LONG_HEX) {
                uVar20 = extraout_RDX_03;
                if (code == CHUNKE_STOP) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  sVar18 = (conn->chunk).dataleft;
                  if (sVar18 != 0) {
                    Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n",sVar18);
                    _Var9 = Curl_multi_pipeline_enabled(conn->data->multi);
                    uVar20 = extraout_RDX_05;
                    if (_Var9) {
                      Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar18);
                      conn->read_pos = conn->read_pos - sVar18;
                      (conn->bits).stream_was_rewound = true;
                      uVar20 = extraout_RDX_06;
                    }
                  }
                }
              }
              else if (code == CHUNKE_WRITE_ERROR) {
                Curl_failf(data,"Failed writing data");
                local_54 = CURLE_WRITE_ERROR;
                uVar20 = extraout_RDX_04;
              }
              else {
                pcVar16 = Curl_chunked_strerror(code);
                Curl_failf(data,"%s in chunked-encoding",pcVar16);
                local_54 = CURLE_RECV_ERROR;
                uVar20 = extraout_RDX_07;
              }
              if (CHUNKE_OK < code) goto LAB_00486630;
            }
            if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
              pcVar7 = &(data->req).bytecount;
              *pcVar7 = *pcVar7 + (data->req).hbuflen;
            }
            lVar13 = (data->req).maxdownload;
            if (lVar13 != -1) {
              lVar15 = bytes_written + (data->req).bytecount;
              lVar24 = lVar15 - lVar13;
              if (lVar13 <= lVar15) {
                if ((lVar24 != 0) && ((data->req).ignorebody == false)) {
                  _Var9 = Curl_multi_pipeline_enabled(conn->data->multi);
                  if (_Var9) {
                    Curl_infof(data,
                               "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                               ,lVar24,(data->state).path,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount,bytes_written);
                    conn->read_pos = conn->read_pos - lVar24;
                    (conn->bits).stream_was_rewound = true;
                  }
                  else {
                    Curl_infof(data,
                               "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                               ,lVar24,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount);
                  }
                }
                bytes_written = (data->req).maxdownload - (data->req).bytecount;
                if (bytes_written < 1) {
                  bytes_written = 0;
                }
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                local_38 = lVar24;
              }
            }
            lVar13 = (data->req).bytecount + bytes_written;
            (data->req).bytecount = lVar13;
            Curl_pgrsSetDownloadCounter(data,lVar13);
            if ((data->req).chunk == false) {
              uVar20 = (ulong)local_48;
              if ((bytes_written != 0) ||
                 ((data->req).badheader != HEADER_NORMAL || (local_48 & 1) != 0)) {
                if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
                  sVar18 = (data->req).maxdownload;
                  if ((sVar18 == 0xffffffffffffffff) || ((long)(data->req).hbuflen <= (long)sVar18))
                  {
                    pcVar16 = (data->state).headerbuff;
                    sVar18 = (data->req).hbuflen;
                  }
                  else {
                    pcVar16 = (data->state).headerbuff;
                  }
                  CVar11 = Curl_client_write(conn,1,pcVar16,sVar18);
                  unaff_R12 = (ulong)CVar11;
                  uVar23 = 1;
                  uVar20 = (ulong)local_48;
                  if (CVar11 != CURLE_OK) goto LAB_00486270;
                  unaff_R12 = 0;
                }
                if (((data->req).badheader < HEADER_ALLBAD) && ((data->req).ignorebody == false)) {
                  pcVar16 = (data->req).str;
                  if ((conn->handler->protocol & 0xc000) == 0) {
                    CVar11 = Curl_client_write(conn,1,pcVar16,bytes_written);
                  }
                  else {
                    CVar11 = Curl_pop3_write(conn,pcVar16,bytes_written);
                  }
                  unaff_R12 = (ulong)CVar11;
                  uVar20 = (ulong)local_48;
                }
                (data->req).badheader = HEADER_NORMAL;
                uVar23 = 1;
                if ((int)unaff_R12 != 0) goto LAB_00486270;
                unaff_R12 = 0;
              }
            }
            else {
              uVar20 = (ulong)local_48;
            }
          }
          p_Var5 = conn->handler->readwrite;
          if (((p_Var5 == (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                          0x0) || (local_38 == 0)) || ((conn->bits).stream_was_rewound != false)) {
            iVar12 = 0;
            uVar23 = 1;
            if ((char)uVar20 != '\0') {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            }
          }
          else {
            ppcVar4 = &(data->req).str;
            *ppcVar4 = *ppcVar4 + bytes_written;
            bytes_written = local_38;
            CVar11 = (*p_Var5)(data,conn,&bytes_written,&readmore);
            uVar23 = 1;
            uVar20 = extraout_RDX_08;
            if (CVar11 != CURLE_OK) goto LAB_0048626d;
            unaff_R12 = 0;
            iVar12 = 2;
            if (readmore == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 1;
            }
          }
        }
      }
      else {
        CVar11 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar18,&bytes_written);
        unaff_R12 = (ulong)CVar11;
        uVar20 = extraout_RDX_00;
        if (CVar11 == CURLE_OK) goto LAB_004861c1;
        iVar12 = 2;
        if (CVar11 == CURLE_AGAIN) goto LAB_00486290;
LAB_00486270:
        iVar12 = 1;
        local_54 = (CURLcode)unaff_R12;
      }
LAB_00486290:
      done = local_40;
      if (iVar12 != 0) {
        if (iVar12 != 2) goto LAB_00486992;
        break;
      }
    } while ((conn->handler->protocol & 0x30) != 0);
    local_54 = CURLE_OK;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      local_54 = CURLE_OK;
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_00486992:
    if (local_54 != CURLE_OK) {
      return local_54;
    }
    if (*done != false) {
      return CURLE_OK;
    }
  }
  uVar22 = uVar23;
  if ((uVar10 & (data->req).keepon & 2) == 0) goto LAB_00486a7f;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar22 = uVar23 | 2;
  if ((data->req).upload_present != 0) goto LAB_0048604a;
  (data->req).upload_fromhere = (data->req).uploadbuf;
  if ((data->req).upload_done == false) {
    pvVar6 = (data->req).protop;
    if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar6 + 0x78) == 2)) {
      (data->req).exp100 = EXP100_AWAITING_CONTINUE;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      tVar26 = curlx_tvnow();
      (data->req).start100 = tVar26;
      Curl_expire(data,(data->set).expect_100_timeout);
      cVar17 = '\x02';
      bVar25 = false;
      uVar22 = uVar23;
      CVar11 = extraout_EAX;
    }
    else {
      if ((conn->handler->protocol & 0x40003) == 0) {
        bVar25 = false;
      }
      else {
        bVar25 = *(int *)((long)pvVar6 + 0x78) == 1;
      }
      CVar11 = Curl_fillreadbuffer(conn,0x4000,(int *)&bytes_written);
      if (CVar11 == CURLE_OK) {
        unaff_R12 = (ulong)(int)bytes_written;
      }
      cVar17 = CVar11 != CURLE_OK;
    }
    if (cVar17 != '\x02') {
      if (cVar17 == '\0') goto LAB_00486c73;
      goto LAB_00486a72;
    }
LAB_00486a70:
    CVar11 = CURLE_OK;
  }
  else {
    unaff_R12 = 0;
    bVar25 = false;
LAB_00486c73:
    if ((unaff_R12 == 0) && (((data->req).keepon & 0x20) != 0)) goto LAB_00486a70;
    if ((long)unaff_R12 < 1) {
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      if (((conn->bits).rewindaftersend != true) ||
         (CVar11 = Curl_readrewind(conn), CVar11 == CURLE_OK)) goto LAB_00486a70;
    }
    else {
      (data->req).upload_present = unaff_R12;
      if ((conn->handler->protocol & 0x30000) == 0) {
        if ((!bVar25) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
          if ((data->state).scratch == (char *)0x0) {
            pcVar16 = (char *)(*Curl_cmalloc)(0x8000);
            (data->state).scratch = pcVar16;
          }
          if ((data->state).scratch == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            CVar11 = CURLE_OUT_OF_MEMORY;
            goto LAB_00486a72;
          }
          uVar20 = 1;
          if (1 < (long)unaff_R12) {
            uVar20 = unaff_R12;
          }
          uVar19 = 0;
          uVar21 = 0;
          do {
            cVar17 = (data->req).upload_fromhere[uVar19];
            pcVar16 = (data->state).scratch;
            if (cVar17 == '\n') {
              uVar1 = uVar21 + 1;
              pcVar16[uVar21] = '\r';
              (data->state).scratch[uVar21 + 1] = '\n';
              uVar21 = uVar1;
              if ((data->set).crlf == false) {
                pcVar7 = &(data->state).infilesize;
                *pcVar7 = *pcVar7 + 1;
              }
            }
            else {
              pcVar16[uVar21] = cVar17;
            }
            uVar19 = uVar19 + 1;
            uVar21 = uVar21 + 1;
          } while (uVar20 != uVar19);
          if (uVar21 != unaff_R12) {
            (data->req).upload_fromhere = (data->state).scratch;
            (data->req).upload_present = uVar21;
          }
        }
      }
      else {
        CVar11 = Curl_smtp_escape_eob(conn,unaff_R12);
        if (CVar11 != CURLE_OK) goto LAB_00486a72;
      }
LAB_0048604a:
      CVar11 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                          (data->req).upload_present,&bytes_written);
      if (CVar11 == CURLE_OK) {
        if ((data->set).verbose == true) {
          Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
        }
        lVar13 = (data->req).writebytecount + bytes_written;
        (data->req).writebytecount = lVar13;
        if (lVar13 == (data->state).infilesize) {
          (data->req).upload_done = true;
          Curl_infof(data,"We are completely uploaded and fine\n");
        }
        lVar13 = (data->req).upload_present - bytes_written;
        if (lVar13 == 0) {
          (data->req).upload_fromhere = (data->req).uploadbuf;
          (data->req).upload_present = 0;
          if ((data->req).upload_done == true) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          }
        }
        else {
          (data->req).upload_present = lVar13;
          ppcVar4 = &(data->req).upload_fromhere;
          *ppcVar4 = *ppcVar4 + bytes_written;
        }
        Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
        goto LAB_00486a70;
      }
    }
  }
LAB_00486a72:
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
LAB_00486a7f:
  tVar26 = curlx_tvnow();
  (data->req).now = tVar26;
  if (uVar22 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (lVar13 = curlx_tvdiff(tVar26,(data->req).start100), (data->set).expect_100_timeout <= lVar13
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar7 = (data->req).bytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).bytecount;
    }
    pcVar7 = (data->req).writebytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).writebytecount;
    }
  }
  iVar12 = Curl_pgrsUpdate(conn);
  CVar11 = CURLE_ABORTED_BY_CALLBACK;
  if (iVar12 == 0) {
    CVar11 = Curl_speedcheck(data,(data->req).now);
  }
  if (CVar11 == CURLE_OK) {
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar13 = (data->req).size;
        if ((((lVar13 != -1) && (lVar15 = (data->req).bytecount, lVar13 != lVar15)) &&
            (lVar15 != lVar13 + (data->state).crlf_conversions)) &&
           ((data->req).newurl == (char *)0x0)) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar12 = Curl_pgrsUpdate(conn);
      if (iVar12 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      lVar13 = Curl_timeleft(data,&(data->req).now,false);
      if (lVar13 < 0) {
        lVar13 = (data->req).size;
        lVar15 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
        cVar8 = (data->req).bytecount;
        if (lVar13 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     lVar15,cVar8);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,lVar15,cVar8,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CVar11;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        bool *done)
{
  struct SessionHandle *data = conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_ready(fd_read, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, k, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      long ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !data->req.newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read",
            k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    else if(!(data->set.opt_no_body) &&
            k->chunk &&
            (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}